

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

void QtPrivate::QStringList_replaceInStrings
               (QStringList *that,QStringView before,QStringView after,CaseSensitivity cs)

{
  QStringView s;
  bool bVar1;
  qsizetype qVar2;
  QChar *in_RCX;
  storage_type_conflict *in_RDX;
  QChar *in_RSI;
  QList<QString> *in_RDI;
  QString *in_R8;
  CaseSensitivity in_R9D;
  long in_FS_OFFSET;
  qsizetype j;
  qsizetype i;
  reference in_stack_ffffffffffffff78;
  QList<QString> *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff90;
  storage_type_conflict *in_stack_ffffffffffffff98;
  long lVar3;
  long local_58;
  long local_50;
  QChar *in_stack_ffffffffffffffc8;
  storage_type_conflict *in_stack_ffffffffffffffd0;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = -1;
  local_58 = 0;
  local_18.m_size = (qsizetype)in_RSI;
  local_18.m_data = in_RDX;
  do {
    qVar2 = QList<QString>::size(in_RDI);
    if (qVar2 <= local_58) {
LAB_0054aefa:
      if (local_50 != -1) {
        while (lVar3 = local_50, qVar2 = QList<QString>::size(in_RDI), lVar3 < qVar2) {
          in_stack_ffffffffffffff78 =
               QList<QString>::operator[]
                         (in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff80 = (QList<QString> *)QStringView::data(&local_18);
          QStringView::size(&local_18);
          QStringView::data((QStringView *)&stack0xffffffffffffffd8);
          QStringView::size((QStringView *)&stack0xffffffffffffffd8);
          QString::replace(in_R8,in_RCX,(qsizetype)in_stack_ffffffffffffffd0,
                           in_stack_ffffffffffffffc8,(qsizetype)in_RDI,in_R9D);
          local_50 = local_50 + 1;
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    QList<QString>::at(in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    s.m_data = in_stack_ffffffffffffff98;
    s.m_size = in_stack_ffffffffffffff90;
    in_stack_ffffffffffffffc8 = (QChar *)local_18.m_size;
    in_stack_ffffffffffffffd0 = local_18.m_data;
    bVar1 = QString::contains(in_stack_ffffffffffffff78,s,CaseInsensitive);
    if (bVar1) {
      local_50 = local_58;
      goto LAB_0054aefa;
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void QtPrivate::QStringList_replaceInStrings(QStringList *that, QStringView before,
                                             QStringView after, Qt::CaseSensitivity cs)
{
    // Before potentially detaching "that" list, check if any string contains "before"
    qsizetype i = -1;
    for (qsizetype j = 0; j < that->size(); ++j) {
        if (that->at(j).contains(before, cs)) {
            i = j;
            break;
        }
    }
    if (i == -1)
        return;

    for (; i < that->size(); ++i)
        (*that)[i].replace(before.data(), before.size(), after.data(), after.size(), cs);
}